

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeQueryStat1(sqlite3 *db,Rtree *pRtree)

{
  int iVar1;
  long local_58;
  int local_4c;
  sqlite3_int64 local_48;
  i64 nRow;
  sqlite3_stmt *psStack_38;
  int rc;
  sqlite3_stmt *p;
  char *zSql;
  char *zFmt;
  Rtree *pRtree_local;
  sqlite3 *db_local;
  
  zSql = "SELECT stat FROM %Q.sqlite_stat1 WHERE tbl = \'%q_rowid\'";
  local_48 = 0;
  zFmt = (char *)pRtree;
  pRtree_local = (Rtree *)db;
  local_4c = sqlite3_table_column_metadata
                       (db,pRtree->zDb,"sqlite_stat1",(char *)0x0,(char **)0x0,(char **)0x0,
                        (int *)0x0,(int *)0x0,(int *)0x0);
  if (local_4c == 0) {
    p = (sqlite3_stmt *)
        sqlite3_mprintf(zSql,*(undefined8 *)(zFmt + 0x30),*(undefined8 *)(zFmt + 0x38));
    if (p == (sqlite3_stmt *)0x0) {
      nRow._4_4_ = 7;
    }
    else {
      nRow._4_4_ = sqlite3_prepare_v2((sqlite3 *)pRtree_local,(char *)p,-1,&stack0xffffffffffffffc8,
                                      (char **)0x0);
      if (nRow._4_4_ == 0) {
        iVar1 = sqlite3_step(psStack_38);
        if (iVar1 == 100) {
          local_48 = sqlite3_column_int64(psStack_38,0);
        }
        nRow._4_4_ = sqlite3_finalize(psStack_38);
      }
      else if (nRow._4_4_ != 7) {
        nRow._4_4_ = 0;
      }
      if (nRow._4_4_ == 0) {
        if (local_48 == 0) {
          zFmt[0x48] = '\0';
          zFmt[0x49] = '\0';
          zFmt[0x4a] = '\x10';
          zFmt[0x4b] = '\0';
          zFmt[0x4c] = '\0';
          zFmt[0x4d] = '\0';
          zFmt[0x4e] = '\0';
          zFmt[0x4f] = '\0';
        }
        else {
          if (local_48 < 0x65) {
            local_58 = 100;
          }
          else {
            local_58 = local_48;
          }
          *(long *)(zFmt + 0x48) = local_58;
        }
      }
      sqlite3_free(p);
    }
    db_local._4_4_ = nRow._4_4_;
  }
  else {
    zFmt[0x48] = '\0';
    zFmt[0x49] = '\0';
    zFmt[0x4a] = '\x10';
    zFmt[0x4b] = '\0';
    zFmt[0x4c] = '\0';
    zFmt[0x4d] = '\0';
    zFmt[0x4e] = '\0';
    zFmt[0x4f] = '\0';
    if (local_4c == 1) {
      local_4c = 0;
    }
    db_local._4_4_ = local_4c;
  }
  return db_local._4_4_;
}

Assistant:

static int rtreeQueryStat1(sqlite3 *db, Rtree *pRtree){
  const char *zFmt = "SELECT stat FROM %Q.sqlite_stat1 WHERE tbl = '%q_rowid'";
  char *zSql;
  sqlite3_stmt *p;
  int rc;
  i64 nRow = 0;

  rc = sqlite3_table_column_metadata(
      db, pRtree->zDb, "sqlite_stat1",0,0,0,0,0,0
  );
  if( rc!=SQLITE_OK ){
    pRtree->nRowEst = RTREE_DEFAULT_ROWEST;
    return rc==SQLITE_ERROR ? SQLITE_OK : rc;
  }
  zSql = sqlite3_mprintf(zFmt, pRtree->zDb, pRtree->zName);
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare_v2(db, zSql, -1, &p, 0);
    if( rc==SQLITE_OK ){
      if( sqlite3_step(p)==SQLITE_ROW ) nRow = sqlite3_column_int64(p, 0);
      rc = sqlite3_finalize(p);
    }else if( rc!=SQLITE_NOMEM ){
      rc = SQLITE_OK;
    }

    if( rc==SQLITE_OK ){
      if( nRow==0 ){
        pRtree->nRowEst = RTREE_DEFAULT_ROWEST;
      }else{
        pRtree->nRowEst = MAX(nRow, RTREE_MIN_ROWEST);
      }
    }
    sqlite3_free(zSql);
  }

  return rc;
}